

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-lore.c
# Opt level: O0

void lore_show_interactive(monster_race *race,monster_lore *lore)

{
  textblock *tb_00;
  textblock *tb;
  monster_lore *lore_local;
  monster_race *race_local;
  
  if ((race != (monster_race *)0x0) && (lore != (monster_lore *)0x0)) {
    event_signal(EVENT_MESSAGE_FLUSH);
    tb_00 = textblock_new();
    lore_description(tb_00,race,lore,false);
    textui_textblock_show(tb_00,(region)ZEXT816((ulong)0),(char *)0x0);
    textblock_free(tb_00);
    return;
  }
  __assert_fail("race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-mon-lore.c"
                ,0xa6,
                "void lore_show_interactive(const struct monster_race *, const struct monster_lore *)"
               );
}

Assistant:

void lore_show_interactive(const struct monster_race *race,
						   const struct monster_lore *lore)
{
	textblock *tb;
	assert(race && lore);

	event_signal(EVENT_MESSAGE_FLUSH);

	tb = textblock_new();
	lore_description(tb, race, lore, false);
	textui_textblock_show(tb, SCREEN_REGION, NULL);
	textblock_free(tb);
}